

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateFieldAccessorDeclarations
          (MessageGenerator *this,Printer *printer)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  CppType CVar5;
  OneofDescriptor *pOVar6;
  FieldOptions *this_00;
  size_type sVar7;
  reference ppFVar8;
  mapped_type *this_01;
  FieldGenerator *pFVar9;
  string *psVar10;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  bool local_1d9;
  string local_168;
  int local_144;
  undefined1 local_140 [4];
  int i_2;
  string local_120;
  bool local_fa;
  allocator local_f9;
  undefined1 local_f8 [6];
  bool dependent_field;
  string local_d8;
  undefined1 local_b8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  FieldDescriptor *field_1;
  FieldDescriptor *pFStack_78;
  int i_1;
  FieldDescriptor *field;
  iterator iStack_68;
  int i;
  FieldDescriptor **local_60;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_58;
  __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
  local_50;
  const_iterator local_48;
  undefined1 local_30 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ordered_fields;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  ordered_fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)printer;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_30);
  iVar3 = Descriptor::field_count(this->descriptor_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::reserve((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_30,(long)iVar3);
  local_50._M_current =
       (FieldDescriptor **)
       std::
       vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                *)local_30);
  __gnu_cxx::
  __normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
  ::__normal_iterator<google::protobuf::FieldDescriptor_const**>
            ((__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>
              *)&local_48,&local_50);
  local_58._M_current =
       (FieldDescriptor **)
       std::
       vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
       ::begin(&this->optimized_order_);
  local_60 = (FieldDescriptor **)
             std::
             vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ::end(&this->optimized_order_);
  iStack_68 = std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::
              insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const**,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)local_30,local_48,local_58,
                         (__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                          )local_60);
  field._4_4_ = 0;
  do {
    iVar3 = field._4_4_;
    iVar4 = Descriptor::field_count(this->descriptor_);
    if (iVar4 <= iVar3) {
      for (field_1._4_4_ = 0;
          sVar7 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::size((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)local_30), (ulong)(long)field_1._4_4_ < sVar7;
          field_1._4_4_ = field_1._4_4_ + 1) {
        ppFVar8 = std::
                  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ::operator[]((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                *)local_30,(long)field_1._4_4_);
        vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)*ppFVar8;
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                  ((Printer *)
                   ordered_fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_b8);
        SetCommonFieldVariables
                  ((FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_b8,&this->options_);
        FieldConstantName_abi_cxx11_
                  (&local_d8,(cpp *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,field_00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_f8,"constant_name",&local_f9);
        this_01 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_b8,(key_type *)local_f8);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_d8);
        std::__cxx11::string::~string((string *)local_f8);
        std::allocator<char>::~allocator((allocator<char> *)&local_f9);
        std::__cxx11::string::~string((string *)&local_d8);
        local_1d9 = false;
        if ((this->use_dependent_base_ & 1U) != 0) {
          local_1d9 = IsFieldDependent((FieldDescriptor *)
                                       vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        local_fa = local_1d9;
        if (((local_1d9 != false) &&
            (CVar5 = FieldDescriptor::cpp_type
                               ((FieldDescriptor *)
                                vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
            CVar5 == CPPTYPE_MESSAGE)) &&
           (bVar2 = FieldDescriptor::is_map
                              ((FieldDescriptor *)
                               vars._M_t._M_impl.super__Rb_tree_header._M_node_count),
           ppFVar1 = ordered_fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage, !bVar2)) {
          FieldMessageTypeName_abi_cxx11_
                    (&local_120,(cpp *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     field_01);
          DependentTypeName_abi_cxx11_
                    ((string *)local_140,
                     (cpp *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,field_02);
          io::Printer::Print((Printer *)ppFVar1,
                             "private:\ntypedef $field_type$ $dependent_type$;\npublic:\n",
                             "field_type",&local_120,"dependent_type",(string *)local_140);
          std::__cxx11::string::~string((string *)local_140);
          std::__cxx11::string::~string((string *)&local_120);
        }
        bVar2 = FieldDescriptor::is_repeated
                          ((FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count)
        ;
        if (bVar2) {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_b8,"$deprecated_attr$int $name$_size() const;\n");
        }
        else {
          bVar2 = anon_unknown_0::HasHasMethod
                            ((FieldDescriptor *)
                             vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (bVar2) {
            io::Printer::Print((Printer *)
                               ordered_fields.
                               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)local_b8,"$deprecated_attr$bool has_$name$() const;\n");
          }
          else {
            bVar2 = anon_unknown_0::HasPrivateHasMethod
                              ((FieldDescriptor *)
                               vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            if (bVar2) {
              io::Printer::Print((Printer *)
                                 ordered_fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_b8,"private:\nbool has_$name$() const;\npublic:\n");
            }
          }
        }
        if ((local_fa & 1U) == 0) {
          io::Printer::Print((Printer *)
                             ordered_fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_b8,"$deprecated_attr$void clear_$name$();\n");
        }
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)local_b8,
                           "$deprecated_attr$static const int $constant_name$ = $number$;\n");
        pFVar9 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count
                           );
        (*pFVar9->_vptr_FieldGenerator[5])
                  (pFVar9,ordered_fields.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,"\n");
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_b8);
      }
      iVar3 = Descriptor::extension_range_count(this->descriptor_);
      if (0 < iVar3) {
        io::Printer::Print((Printer *)
                           ordered_fields.
                           super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           "GOOGLE_PROTOBUF_EXTENSION_ACCESSORS($classname$)\n","classname",
                           &this->classname_);
      }
      for (local_144 = 0; iVar3 = local_144, iVar4 = Descriptor::oneof_decl_count(this->descriptor_)
          , ppFVar1 = ordered_fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage, iVar3 < iVar4;
          local_144 = local_144 + 1) {
        pOVar6 = Descriptor::oneof_decl(this->descriptor_,local_144);
        psVar10 = OneofDescriptor::name_abi_cxx11_(pOVar6);
        UnderscoresToCamelCase(&local_168,psVar10,true);
        pOVar6 = Descriptor::oneof_decl(this->descriptor_,local_144);
        psVar10 = OneofDescriptor::name_abi_cxx11_(pOVar6);
        io::Printer::Print((Printer *)ppFVar1,"$camel_oneof_name$Case $oneof_name$_case() const;\n",
                           "camel_oneof_name",&local_168,"oneof_name",psVar10);
        std::__cxx11::string::~string((string *)&local_168);
      }
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_30);
      return;
    }
    pFStack_78 = Descriptor::field(this->descriptor_,field._4_4_);
    pOVar6 = FieldDescriptor::containing_oneof(pFStack_78);
    if (pOVar6 == (OneofDescriptor *)0x0) {
      this_00 = FieldDescriptor::options(pFStack_78);
      bVar2 = FieldOptions::weak(this_00);
      if (bVar2) goto LAB_003e7102;
    }
    else {
LAB_003e7102:
      std::
      vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   *)local_30,&stack0xffffffffffffff88);
    }
    field._4_4_ = field._4_4_ + 1;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateFieldAccessorDeclarations(io::Printer* printer) {
  // optimized_fields_ does not contain fields where
  //    field->containing_oneof() != NULL
  // so we need to iterate over those as well.
  //
  // We place the non-oneof fields in optimized_order_, as that controls the
  // order of the _has_bits_ entries and we want GDB's pretty printers to be
  // able to infer these indices from the k[FIELDNAME]FieldNumber order.
  std::vector<const FieldDescriptor*> ordered_fields;
  ordered_fields.reserve(descriptor_->field_count());

  ordered_fields.insert(
      ordered_fields.begin(), optimized_order_.begin(), optimized_order_.end());
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->containing_oneof() == NULL && !field->options().weak()) {
      continue;
    }
    ordered_fields.push_back(field);
  }

  for (int i = 0; i < ordered_fields.size(); i++) {
    const FieldDescriptor* field = ordered_fields[i];

    PrintFieldComment(printer, field);

    std::map<string, string> vars;
    SetCommonFieldVariables(field, &vars, options_);
    vars["constant_name"] = FieldConstantName(field);

    bool dependent_field = use_dependent_base_ && IsFieldDependent(field);
    if (dependent_field &&
        field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_map()) {
      // If this field is dependent, the dependent base class determines
      // the message type from the derived class (which is a template
      // parameter). This typedef is for that:
      printer->Print(
          "private:\n"
          "typedef $field_type$ $dependent_type$;\n"
          "public:\n",
          "field_type", FieldMessageTypeName(field),
          "dependent_type", DependentTypeName(field));
    }

    if (field->is_repeated()) {
      printer->Print(vars, "$deprecated_attr$int $name$_size() const;\n");
    } else if (HasHasMethod(field)) {
      printer->Print(vars, "$deprecated_attr$bool has_$name$() const;\n");
    } else if (HasPrivateHasMethod(field)) {
      printer->Print(vars,
          "private:\n"
          "bool has_$name$() const;\n"
          "public:\n");
    }

    if (!dependent_field) {
      // If this field is dependent, then its clear_() method is in the
      // depenent base class. (See also GenerateDependentAccessorDeclarations.)
      printer->Print(vars, "$deprecated_attr$void clear_$name$();\n");
    }
    printer->Print(vars,
                   "$deprecated_attr$static const int $constant_name$ = "
                   "$number$;\n");

    // Generate type-specific accessor declarations.
    field_generators_.get(field).GenerateAccessorDeclarations(printer);

    printer->Print("\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    // Generate accessors for extensions.  We just call a macro located in
    // extension_set.h since the accessors about 80 lines of static code.
    printer->Print(
      "GOOGLE_PROTOBUF_EXTENSION_ACCESSORS($classname$)\n",
      "classname", classname_);
  }

  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    printer->Print(
        "$camel_oneof_name$Case $oneof_name$_case() const;\n",
        "camel_oneof_name",
        UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true),
        "oneof_name", descriptor_->oneof_decl(i)->name());
  }
}